

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

Inst * __thiscall re2::Prog::Inst::Dump_abi_cxx11_(Inst *this)

{
  byte bVar1;
  byte bVar2;
  InstOp IVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  Inst *in_RSI;
  Inst *this_local;
  
  IVar3 = opcode(in_RSI);
  switch(IVar3) {
  case kInstAlt:
    uVar5 = out(in_RSI);
    StringPrintf_abi_cxx11_
              ((char *)this,"alt -> %d | %d",(ulong)uVar5,(ulong)(in_RSI->field_1).out1_);
    break;
  case kInstAltMatch:
    uVar5 = out(in_RSI);
    StringPrintf_abi_cxx11_
              ((char *)this,"altmatch -> %d | %d",(ulong)uVar5,(ulong)(in_RSI->field_1).out1_);
    break;
  case kInstByteRange:
    pcVar6 = "";
    if ((in_RSI->field_1).field_3.foldcase_ != '\0') {
      pcVar6 = "/i";
    }
    bVar1 = (in_RSI->field_1).field_3.lo_;
    bVar2 = (in_RSI->field_1).field_3.hi_;
    uVar5 = out(in_RSI);
    StringPrintf_abi_cxx11_
              ((char *)this,"byte%s [%02x-%02x] -> %d",pcVar6,(ulong)bVar1,(ulong)bVar2,(ulong)uVar5
              );
    break;
  case kInstCapture:
    uVar5 = (in_RSI->field_1).out1_;
    uVar4 = out(in_RSI);
    StringPrintf_abi_cxx11_((char *)this,"capture %d -> %d",(ulong)uVar5,(ulong)uVar4);
    break;
  case kInstEmptyWidth:
    uVar5 = (in_RSI->field_1).out1_;
    uVar4 = out(in_RSI);
    StringPrintf_abi_cxx11_((char *)this,"emptywidth %#x -> %d",(ulong)uVar5,(ulong)uVar4);
    break;
  case kInstMatch:
    uVar5 = match_id(in_RSI);
    StringPrintf_abi_cxx11_((char *)this,"match! %d",(ulong)uVar5);
    break;
  case kInstNop:
    uVar5 = out(in_RSI);
    StringPrintf_abi_cxx11_((char *)this,"nop -> %d",(ulong)uVar5);
    break;
  case kInstFail:
    StringPrintf_abi_cxx11_((char *)this,"fail");
    break;
  default:
    IVar3 = opcode(in_RSI);
    StringPrintf_abi_cxx11_((char *)this,"opcode %d",(ulong)IVar3);
  }
  return this;
}

Assistant:

string Prog::Inst::Dump() {
  switch (opcode()) {
    default:
      return StringPrintf("opcode %d", static_cast<int>(opcode()));

    case kInstAlt:
      return StringPrintf("alt -> %d | %d", out(), out1_);

    case kInstAltMatch:
      return StringPrintf("altmatch -> %d | %d", out(), out1_);

    case kInstByteRange:
      return StringPrintf("byte%s [%02x-%02x] -> %d",
                          foldcase_ ? "/i" : "",
                          lo_, hi_, out());

    case kInstCapture:
      return StringPrintf("capture %d -> %d", cap_, out());

    case kInstEmptyWidth:
      return StringPrintf("emptywidth %#x -> %d",
                          static_cast<int>(empty_), out());

    case kInstMatch:
      return StringPrintf("match! %d", match_id());

    case kInstNop:
      return StringPrintf("nop -> %d", out());

    case kInstFail:
      return StringPrintf("fail");
  }
}